

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

uint8_t phosg::fgetcx(FILE *f)

{
  int iVar1;
  io_error *piVar2;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  int local_14;
  FILE *pFStack_10;
  int ret;
  FILE *f_local;
  
  pFStack_10 = (FILE *)f;
  local_14 = fgetc((FILE *)f);
  if (local_14 != -1) {
    return (uint8_t)local_14;
  }
  iVar1 = feof(pFStack_10);
  if (iVar1 != 0) {
    local_4d = 1;
    piVar2 = (io_error *)__cxa_allocate_exception(0x20);
    iVar1 = fileno(pFStack_10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"end of stream",&local_39);
    io_error::io_error(piVar2,iVar1,&local_38);
    local_4d = 0;
    __cxa_throw(piVar2,&io_error::typeinfo,io_error::~io_error);
  }
  piVar2 = (io_error *)__cxa_allocate_exception(0x20);
  iVar1 = fileno(pFStack_10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"cannot read from stream",&local_71);
  io_error::io_error(piVar2,iVar1,&local_70);
  __cxa_throw(piVar2,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

uint8_t fgetcx(FILE* f) {
  int ret = ::fgetc(f);
  if (ret == EOF) {
    if (feof(f)) {
      throw io_error(fileno(f), "end of stream");
    } else {
      throw io_error(fileno(f), "cannot read from stream");
    }
  }
  return ret;
}